

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

SampledSpectrum __thiscall
pbrt::ImageInfiniteLight::Phi(ImageInfiniteLight *this,SampledWavelengths lambda)

{
  undefined8 uVar1;
  undefined8 uVar2;
  WrapMode2D wrapMode;
  array<float,_4> aVar3;
  Float *pFVar4;
  long in_RDI;
  Float FVar5;
  undefined1 auVar10 [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  SampledSpectrum SVar15;
  RGB RVar16;
  int c;
  RGB rgb;
  int u;
  int v;
  int height;
  int width;
  SampledSpectrum sumL;
  int in_stack_fffffffffffffed8;
  Float in_stack_fffffffffffffedc;
  SampledSpectrum *in_stack_fffffffffffffee0;
  SampledSpectrum *in_stack_fffffffffffffee8;
  SampledSpectrum *in_stack_fffffffffffffef0;
  undefined8 in_stack_ffffffffffffff10;
  Float in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  RGBIlluminantSpectrum *this_00;
  undefined8 in_stack_ffffffffffffff50;
  Float in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  WrapMode in_stack_ffffffffffffff64;
  Float in_stack_ffffffffffffff68;
  Tuple2<pbrt::Point2,_int> in_stack_ffffffffffffff6c;
  RGB in_stack_ffffffffffffff7c;
  int local_58;
  RGB local_54;
  int local_48;
  int local_44;
  Tuple2<pbrt::Point2,_int> local_40;
  int local_38;
  Tuple2<pbrt::Point2,_int> local_34;
  int local_2c;
  undefined1 auVar6 [64];
  undefined1 auVar14 [56];
  
  SampledSpectrum::SampledSpectrum(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
  local_34 = (Tuple2<pbrt::Point2,_int>)Image::Resolution((Image *)(in_RDI + 0x98));
  local_2c = local_34.x;
  local_40 = (Tuple2<pbrt::Point2,_int>)Image::Resolution((Image *)(in_RDI + 0x98));
  local_38 = local_40.y;
  for (local_44 = 0; local_44 < local_38; local_44 = local_44 + 1) {
    for (local_48 = 0; local_48 < local_2c; local_48 = local_48 + 1) {
      RGB::RGB(&local_54);
      for (local_58 = 0; local_58 < 3; local_58 = local_58 + 1) {
        in_stack_fffffffffffffef0 = (SampledSpectrum *)(in_RDI + 0x98);
        Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffffee0,(int)in_stack_fffffffffffffedc,
                            in_stack_fffffffffffffed8);
        WrapMode2D::WrapMode2D
                  ((WrapMode2D *)in_stack_fffffffffffffef0,
                   (WrapMode)((ulong)in_stack_fffffffffffffee8 >> 0x20));
        wrapMode.wrap.values[1] = (WrapMode)in_stack_ffffffffffffff68;
        wrapMode.wrap.values[0] = in_stack_ffffffffffffff64;
        FVar5 = Image::GetChannel((Image *)CONCAT44(in_stack_ffffffffffffff5c,
                                                    in_stack_ffffffffffffff58),
                                  (Point2i)in_stack_ffffffffffffff6c,
                                  (int)SUB84(in_stack_ffffffffffffff50,4),wrapMode);
        pFVar4 = RGB::operator[](&local_54,local_58);
        *pFVar4 = FVar5;
      }
      in_stack_fffffffffffffee0 = *(SampledSpectrum **)(in_RDI + 0x130);
      auVar10 = ZEXT856(0);
      RVar16.b = in_stack_ffffffffffffff18;
      RVar16.r = (Float)(int)in_stack_ffffffffffffff10;
      RVar16.g = (Float)(int)((ulong)in_stack_ffffffffffffff10 >> 0x20);
      in_stack_ffffffffffffff50 = local_54._0_8_;
      in_stack_ffffffffffffff58 = local_54.b;
      RVar16 = ClampZero(RVar16);
      in_stack_ffffffffffffff68 = RVar16.b;
      auVar6._0_8_ = RVar16._0_8_;
      auVar6._8_56_ = auVar10;
      this_00 = (RGBIlluminantSpectrum *)vmovlpd_avx(auVar6._0_16_);
      in_stack_ffffffffffffff64 = (WrapMode)((ulong)this_00 >> 0x20);
      auVar10 = (undefined1  [56])0x0;
      auVar14 = (undefined1  [56])0x0;
      in_stack_fffffffffffffee8 = (SampledSpectrum *)&stack0xffffffffffffff70;
      RGBIlluminantSpectrum::RGBIlluminantSpectrum
                (this_00,(RGBColorSpace *)
                         CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                 in_stack_ffffffffffffff7c);
      SVar15 = RGBIlluminantSpectrum::Sample
                         (this_00,(SampledWavelengths *)
                                  CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      auVar11._0_8_ = SVar15.values.values._8_8_;
      auVar11._8_56_ = auVar14;
      auVar7._0_8_ = SVar15.values.values._0_8_;
      auVar7._8_56_ = auVar10;
      vmovlpd_avx(auVar7._0_16_);
      vmovlpd_avx(auVar11._0_16_);
      SampledSpectrum::operator+=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    }
  }
  Sqr<float>(*(float *)(in_RDI + 0x148));
  auVar14 = (undefined1  [56])0x0;
  auVar10 = (undefined1  [56])0x0;
  FVar5 = (Float)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  SVar15 = pbrt::operator*(FVar5,(SampledSpectrum *)
                                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  auVar12._0_8_ = SVar15.values.values._8_8_;
  auVar12._8_56_ = auVar14;
  auVar8._0_8_ = SVar15.values.values._0_8_;
  auVar8._8_56_ = auVar10;
  vmovlpd_avx(auVar8._0_16_);
  vmovlpd_avx(auVar12._0_16_);
  auVar10 = ZEXT856(auVar10._0_8_);
  SVar15 = SampledSpectrum::operator/(in_stack_fffffffffffffee8,FVar5);
  auVar13._0_8_ = SVar15.values.values._8_8_;
  auVar13._8_56_ = auVar14;
  auVar9._0_8_ = SVar15.values.values._0_8_;
  auVar9._8_56_ = auVar10;
  uVar1 = vmovlpd_avx(auVar9._0_16_);
  uVar2 = vmovlpd_avx(auVar13._0_16_);
  aVar3.values[2] = (float)(int)uVar2;
  aVar3.values[3] = (float)(int)((ulong)uVar2 >> 0x20);
  aVar3.values[0] = (float)(int)uVar1;
  aVar3.values[1] = (float)(int)((ulong)uVar1 >> 0x20);
  return (array<float,_4>)(array<float,_4>)aVar3.values;
}

Assistant:

SampledSpectrum ImageInfiniteLight::Phi(SampledWavelengths lambda) const {
    // We're computing fluence, then converting to power...
    SampledSpectrum sumL(0.);

    int width = image.Resolution().x, height = image.Resolution().y;
    for (int v = 0; v < height; ++v) {
        for (int u = 0; u < width; ++u) {
            RGB rgb;
            for (int c = 0; c < 3; ++c)
                rgb[c] = image.GetChannel({u, v}, c, WrapMode::OctahedralSphere);
            sumL +=
                RGBIlluminantSpectrum(*imageColorSpace, ClampZero(rgb)).Sample(lambda);
        }
    }
    // Integrating over the sphere, so 4pi for that.  Then one more for Pi
    // r^2 for the area of the disk receiving illumination...
    return 4 * Pi * Pi * Sqr(sceneRadius) * scale * sumL / (width * height);
}